

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

CPAccessResult aa64_daif_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  uint uVar1;
  ARMMMUIdx AVar2;
  
  if ((env->features & 0x200) == 0) {
    if (env->aarch64 == 0) {
      if ((env->uncached_cpsr & 0x1f) != 0x10) {
        return CP_ACCESS_OK;
      }
      goto LAB_0061a91e;
    }
    uVar1 = env->pstate >> 2 & 3;
  }
  else {
    if ((env->v7m).exception != 0) {
      return CP_ACCESS_OK;
    }
    uVar1 = ~(env->v7m).control[(env->v7m).secure] & 1;
  }
  if (uVar1 != 0) {
    return CP_ACCESS_OK;
  }
LAB_0061a91e:
  AVar2 = arm_mmu_idx_el_aarch64(env,0);
  if ((*(byte *)((long)(env->cp15).cptr_el + (ulong)(AVar2 == ARMMMUIdx_E20_0) * 8 + -0x1f) & 2) !=
      0) {
    return CP_ACCESS_OK;
  }
  return CP_ACCESS_TRAP;
}

Assistant:

static CPAccessResult aa64_daif_access(CPUARMState *env, const ARMCPRegInfo *ri,
                                       bool isread)
{
    if (arm_current_el(env) == 0 && !(arm_sctlr(env, 0) & SCTLR_UMA)) {
        return CP_ACCESS_TRAP;
    }
    return CP_ACCESS_OK;
}